

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QString * __thiscall QDir::filePath(QString *__return_storage_ptr__,QDir *this,QString *fileName)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  undefined1 local_40 [16];
  QString *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = treatAsAbsolute(fileName);
  if (bVar4) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&fileName->d);
      return __return_storage_ptr__;
    }
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::filePath((QString *)&local_58,&((this->d_ptr).d.ptr)->dirEntry);
    qVar3 = local_58.size;
    pcVar2 = local_58.ptr;
    pDVar1 = local_58.d;
    if ((fileName->d).size == 0) {
      local_58.d = (Data *)0x0;
      local_58.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = pcVar2;
      local_58.size = 0;
      (__return_storage_ptr__->d).size = qVar3;
    }
    else if (((undefined1 *)local_58.size == (undefined1 *)0x0) ||
            (bVar4 = QString::endsWith((QString *)&local_58,(QChar)0x2f,CaseSensitive), bVar4)) {
      local_40._0_8_ = &local_58;
      local_40._8_8_ = fileName;
      QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                (__return_storage_ptr__,(QStringBuilder<QString_&,_const_QString_&> *)local_40);
    }
    else {
      local_40._8_2_ = 0x2f;
      local_40._0_8_ = &local_58;
      local_30 = fileName;
      QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                (__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&> *)local_40);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::filePath(const QString &fileName) const
{
    if (treatAsAbsolute(fileName))
        return fileName;

    Q_D(const QDir);
    QString ret = d->dirEntry.filePath();
    if (fileName.isEmpty())
        return ret;

#ifdef Q_OS_WIN
    if (fileName.startsWith(u'/') || fileName.startsWith(u'\\')) {
        // Handle the "absolute except for drive" case (i.e. \blah not c:\blah):
        const qsizetype drive = drivePrefixLength(ret);
        return drive > 0 ? QStringView{ret}.left(drive) % fileName : fileName;
    }
#endif // Q_OS_WIN

    if (ret.isEmpty() || ret.endsWith(u'/'))
        return ret % fileName;
    return ret % u'/' % fileName;
}